

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O3

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::default_busy_wait>_>
::Consume::advance_head(Consume *this)

{
  UnmovableFastTestAllocator<256UL> *this_00;
  __int_type _Var1;
  __int_type _Var2;
  ulong uVar3;
  uintptr_t uint_pointer;
  ulong uVar4;
  uintptr_t uint_pointer_1;
  ulong uVar5;
  
  this_00 = *(UnmovableFastTestAllocator<256UL> **)this;
  _Var1 = *(__int_type *)(this + 8);
  _Var2 = this_00[2].m_living_bytes.super___atomic_base<unsigned_long>._M_i;
  if (_Var2 == _Var1) {
    uVar3 = *(ulong *)(this + 0x10);
    this_00[2].m_living_bytes.super___atomic_base<unsigned_long>._M_i = uVar3 & 0xfffffffffffffff0;
    uVar4 = _Var2;
    if ((uVar3 & 4) != 0) {
      density_tests::UnmovableFastTestAllocator<256UL>::deallocate
                (this_00,*(void **)(_Var2 + 0x10),*(size_t *)(_Var2 + 0x18),
                 *(size_t *)(_Var2 + 0x20),0);
      uVar4 = *(ulong *)(this + 8);
    }
    uVar5 = uVar3 ^ uVar4;
    if (((uVar3 & 0xf0) == 0) == uVar5 < 0x100) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x119);
      uVar4 = *(ulong *)(this + 8);
    }
    if ((uVar4 == (uVar4 & 0xffffffffffffff00 | 0xc0)) == uVar5 < 0x100) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x11c);
    }
    if (0xff < uVar5) {
      density_tests::UnmovableFastTestAllocator<256UL>::deallocate_page
                (*(UnmovableFastTestAllocator<256UL> **)this,*(void **)(this + 8));
    }
  }
  return _Var2 == _Var1;
}

Assistant:

bool advance_head()
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    if (m_queue->m_head == m_control)
                    {
                        m_queue->m_head = next;
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (Base::s_deallocate_zeroed_pages)
                        {
                            raw_atomic_store(&m_control->m_next, uintptr_t(0));
                        }

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }